

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O3

void __thiscall PartVolumeButton::contextMenuEvent(PartVolumeButton *this,QContextMenuEvent *event)

{
  QAction *pQVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QWidgetAction volumeControlAction;
  QSlider volumeControlSlider;
  QMenu menu;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QWidgetAction local_98 [16];
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QObject local_58 [8];
  QPoint local_50 [5];
  
  event[0xc] = (QContextMenuEvent)0x1;
  QMenu::QMenu((QMenu *)local_50,(QWidget *)this);
  QVar2.m_data = (storage_type *)0x6;
  QVar2.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar2);
  local_b8 = local_88;
  uStack_b0 = uStack_80;
  local_a8 = local_78;
  pQVar1 = (QAction *)QMenu::addMenu((QString *)local_50);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  QWidgetAction::QWidgetAction(local_98,(QObject *)pQVar1);
  QSlider::QSlider((QSlider *)&local_88,(QWidget *)pQVar1);
  QAbstractSlider::setRange((int)&local_88,0);
  QAbstractSlider::setValue((int)&local_88);
  QObject::connect(local_58,(char *)&local_88,(QObject *)"2valueChanged(int)",(char *)this,0x1912e5)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QWidgetAction::setDefaultWidget((QWidget *)local_98);
  QWidget::addAction(pQVar1);
  QVar3.m_data = (storage_type *)0xc;
  QVar3.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar3);
  local_d8 = local_b8;
  uStack_d0 = uStack_b0;
  local_c8 = local_a8;
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_d8,(char *)this,
                   (QKeySequence *)"1handleResetVolumeTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x4;
  QVar4.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar4);
  local_d8 = local_b8;
  uStack_d0 = uStack_b0;
  local_c8 = local_a8;
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_d8,(char *)this,
                   (QKeySequence *)"1handleSoloTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar5);
  local_d8 = local_b8;
  uStack_d0 = uStack_b0;
  local_c8 = local_a8;
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_d8,(char *)this,
                   (QKeySequence *)"1handleUnmuteAllTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x9;
  QVar6.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar6);
  local_d8 = local_b8;
  uStack_d0 = uStack_b0;
  local_c8 = local_a8;
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_d8,(char *)this,
                   (QKeySequence *)"1handleResetAllTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  QMenu::exec(local_50,(QAction *)(event + 0x30));
  QSlider::~QSlider((QSlider *)&local_88);
  QWidgetAction::~QWidgetAction(local_98);
  QMenu::~QMenu((QMenu *)local_50);
  return;
}

Assistant:

void PartVolumeButton::contextMenuEvent(QContextMenuEvent *event) {
	event->accept();
	QMenu menu(this);
	QMenu *volumeMenu = menu.addMenu("Volume");
	QWidgetAction volumeControlAction(volumeMenu);
	QSlider volumeControlSlider(volumeMenu);
	volumeControlSlider.setRange(0, 100);
	volumeControlSlider.setValue(qBound(0, volume, 100));
	connect(&volumeControlSlider, SIGNAL(valueChanged(int)), SLOT(handleVolumeChanged(int)));
	volumeControlAction.setDefaultWidget(&volumeControlSlider);
	volumeMenu->addAction(&volumeControlAction);
	menu.addAction("Reset Volume", this, SLOT(handleResetVolumeTriggered()));
	menu.addAction("Solo", this, SLOT(handleSoloTriggered()));
	menu.addAction("Unmute All", this, SLOT(handleUnmuteAllTriggered()));
	menu.addAction("Reset All", this, SLOT(handleResetAllTriggered()));
	menu.exec(event->globalPos());
}